

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTime.cxx
# Opt level: O0

bool __thiscall cmFileTime::Load(cmFileTime *this,string *fileName)

{
  int iVar1;
  char *__file;
  undefined1 local_b0 [8];
  stat fst;
  string *fileName_local;
  cmFileTime *this_local;
  
  fst.__glibc_reserved[2] = (__syscall_slong_t)fileName;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_b0);
  if (iVar1 == 0) {
    this->NS = fst.st_atim.tv_nsec * 1000000000 + fst.st_mtim.tv_sec;
  }
  return iVar1 == 0;
}

Assistant:

bool cmFileTime::Load(std::string const& fileName)
{
#if !defined(_WIN32) || defined(__CYGWIN__)
  // POSIX version.  Use the stat function.
  struct stat fst;
  if (::stat(fileName.c_str(), &fst) != 0) {
    return false;
  }
#  if CMake_STAT_HAS_ST_MTIM
  // Nanosecond resolution
  this->NS = fst.st_mtim.tv_sec * NsPerS + fst.st_mtim.tv_nsec;
#  elif CMake_STAT_HAS_ST_MTIMESPEC
  // Nanosecond resolution
  this->NS = fst.st_mtimespec.tv_sec * NsPerS + fst.st_mtimespec.tv_nsec;
#  else
  // Second resolution
  this->NS = fst.st_mtime * NsPerS;
#  endif
#else
  // Windows version.  Get the modification time from extended file attributes.
  WIN32_FILE_ATTRIBUTE_DATA fdata;
  if (!GetFileAttributesExW(cmsys::Encoding::ToWide(fileName).c_str(),
                            GetFileExInfoStandard, &fdata)) {
    return false;
  }

  // Copy the file time to the output location.
  this->NS = (static_cast<NSC>(fdata.ftLastWriteTime.dwHighDateTime) << 32) |
    static_cast<NSC>(fdata.ftLastWriteTime.dwLowDateTime);
  // The file time resolution is 100 ns.
  this->NS *= 100;
#endif
  return true;
}